

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Demo6502.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 local_38f0 [8];
  DemoM6502 demo;
  char **argv_local;
  int argc_local;
  
  demo._14544_8_ = argv;
  DemoM6502::DemoM6502((DemoM6502 *)local_38f0);
  olc::PixelGameEngine::Construct((PixelGameEngine *)local_38f0,0x30c,0x1e0,2,2,false,false,false);
  olc::PixelGameEngine::Start((PixelGameEngine *)local_38f0);
  DemoM6502::~DemoM6502((DemoM6502 *)local_38f0);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
  DemoM6502 demo;
  demo.Construct(780, 480, 2, 2);
  demo.Start();
  return 0;
}